

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

CURLcode Curl_http2_add_child(Curl_easy *parent,Curl_easy *child,_Bool exclusive)

{
  undefined1 *puVar1;
  Curl_http2_dep *pCVar2;
  Curl_http2_dep **ppCVar3;
  Curl_http2_dep *pCVar4;
  Curl_http2_dep *pCVar5;
  Curl_http2_dep *pCVar6;
  Curl_http2_dep *pCVar7;
  
  if (parent != (Curl_easy *)0x0) {
    pCVar4 = (Curl_http2_dep *)(*Curl_ccalloc)(1,0x10);
    if (pCVar4 == (Curl_http2_dep *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pCVar4->data = child;
    pCVar5 = (Curl_http2_dep *)&(parent->set).stream_dependents;
    pCVar2 = (parent->set).stream_dependents;
    pCVar6 = pCVar2;
    if (exclusive && pCVar2 != (Curl_http2_dep *)0x0) {
      do {
        (pCVar6->data->set).stream_depends_on = child;
        ppCVar3 = &pCVar6->next;
        pCVar6 = *ppCVar3;
      } while (*ppCVar3 != (Curl_http2_dep *)0x0);
      pCVar6 = (Curl_http2_dep *)&(child->set).stream_dependents;
      do {
        pCVar7 = pCVar6;
        pCVar6 = pCVar7->next;
      } while (pCVar6 != (Curl_http2_dep *)0x0);
      pCVar7->next = pCVar2;
      *(Curl_http2_dep **)pCVar5 = (Curl_http2_dep *)0x0;
    }
    else {
      while (pCVar2 != (Curl_http2_dep *)0x0) {
        puVar1 = &(pCVar2->data->set).field_0x8e2;
        *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffffdfffffffffff;
        pCVar5 = pCVar5->next;
        pCVar2 = pCVar5->next;
      }
    }
    pCVar5->next = pCVar4;
  }
  (child->set).stream_depends_on = parent;
  *(ulong *)&(child->set).field_0x8e2 =
       *(ulong *)&(child->set).field_0x8e2 & 0xffffdfffffffffff | (ulong)exclusive << 0x2d;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http2_add_child(struct Curl_easy *parent,
                              struct Curl_easy *child,
                              bool exclusive)
{
  if(parent) {
    struct Curl_http2_dep **tail;
    struct Curl_http2_dep *dep = calloc(1, sizeof(struct Curl_http2_dep));
    if(!dep)
      return CURLE_OUT_OF_MEMORY;
    dep->data = child;

    if(parent->set.stream_dependents && exclusive) {
      struct Curl_http2_dep *node = parent->set.stream_dependents;
      while(node) {
        node->data->set.stream_depends_on = child;
        node = node->next;
      }

      tail = &child->set.stream_dependents;
      while(*tail)
        tail = &(*tail)->next;

      DEBUGASSERT(!*tail);
      *tail = parent->set.stream_dependents;
      parent->set.stream_dependents = 0;
    }

    tail = &parent->set.stream_dependents;
    while(*tail) {
      (*tail)->data->set.stream_depends_e = FALSE;
      tail = &(*tail)->next;
    }

    DEBUGASSERT(!*tail);
    *tail = dep;
  }

  child->set.stream_depends_on = parent;
  child->set.stream_depends_e = exclusive;
  return CURLE_OK;
}